

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::SetMapIteratorValue
          (MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this,MapIterator *map_iter)

{
  long lVar1;
  long lVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar1 = *map_iter->iter_;
  if (lVar1 != 0) {
    lVar2 = **(long **)(lVar1 + 8);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,lVar2,(*(long **)(lVar1 + 8))[1] + lVar2);
    MapKey::SetType(&map_iter->key_,CPPTYPE_STRING);
    std::__cxx11::string::operator=((string *)&map_iter->key_,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    (map_iter->value_).data_ = (void *)(*(long *)(lVar1 + 8) + 0x20);
  }
  return;
}

Assistant:

void MapField<Derived, Key, T, kKeyFieldType, kValueFieldType,
              default_enum_value>::SetMapIteratorValue(MapIterator* map_iter)
    const {
  const Map<Key, T>& map = impl_.GetMap();
  typename Map<Key, T>::const_iterator iter =
      TypeDefinedMapFieldBase<Key, T>::InternalGetIterator(map_iter);
  if (iter == map.end()) return;
  SetMapKey(&map_iter->key_, iter->first);
  map_iter->value_.SetValue(&iter->second);
}